

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddGenerated(Parse *pParse,Expr *pExpr,Token *pType)

{
  ushort uVar1;
  Table *pTab;
  Column *pCVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) goto LAB_00166f30;
  if (pParse->eParseMode == '\x01') {
    sqlite3ErrorMsg(pParse,"virtual tables cannot use computed columns");
    goto LAB_00166f30;
  }
  pCVar2 = pTab->aCol;
  lVar5 = (long)pTab->nCol;
  if (pCVar2[lVar5 + -1].iDflt == 0) {
    uVar6 = 0x20;
    bVar3 = true;
    if (pType == (Token *)0x0) {
LAB_00166e9d:
      if (bVar3) {
        pTab->nNVCol = pTab->nNVCol + -1;
      }
      uVar1 = pCVar2[lVar5 + -1].colFlags;
      pCVar2[lVar5 + -1].colFlags = uVar1 | (ushort)uVar6;
      pTab->tabFlags = pTab->tabFlags | uVar6;
      if (((uVar1 & 1) != 0) &&
         (uVar1 = pCVar2[lVar5 + -1].colFlags, pCVar2[lVar5 + -1].colFlags = uVar1 | 1,
         (uVar1 & 0x60) != 0)) {
        sqlite3ErrorMsg(pParse,"generated columns cannot be part of the PRIMARY KEY");
      }
      if (pExpr == (Expr *)0x0) {
        pExpr = (Expr *)0x0;
      }
      else if (pExpr->op == '<') {
        pExpr = sqlite3PExpr(pParse,0xad,pExpr,(Expr *)0x0);
      }
      if ((pExpr != (Expr *)0x0) && (pExpr->op != 'H')) {
        pExpr->affExpr = pCVar2[lVar5 + -1].affinity;
      }
      sqlite3ColumnSetExpr(pParse,pTab,pCVar2 + lVar5 + -1,pExpr);
      pExpr = (Expr *)0x0;
      goto LAB_00166f30;
    }
    if (pType->n == 6) {
      iVar4 = sqlite3_strnicmp("stored",pType->z,6);
      if (iVar4 == 0) {
        uVar6 = 0x40;
        bVar3 = false;
        goto LAB_00166e9d;
      }
    }
    else if (pType->n == 7) {
      iVar4 = sqlite3_strnicmp("virtual",pType->z,7);
      uVar6 = 0x20;
      bVar3 = true;
      if (iVar4 == 0) goto LAB_00166e9d;
    }
  }
  sqlite3ErrorMsg(pParse,"error in generated column \"%s\"",pCVar2[lVar5 + -1].zCnName);
LAB_00166f30:
  if (pExpr != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,pExpr);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddGenerated(Parse *pParse, Expr *pExpr, Token *pType){
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
  u8 eType = COLFLAG_VIRTUAL;
  Table *pTab = pParse->pNewTable;
  Column *pCol;
  if( pTab==0 ){
    /* generated column in an CREATE TABLE IF NOT EXISTS that already exists */
    goto generated_done;
  }
  pCol = &(pTab->aCol[pTab->nCol-1]);
  if( IN_DECLARE_VTAB ){
    sqlite3ErrorMsg(pParse, "virtual tables cannot use computed columns");
    goto generated_done;
  }
  if( pCol->iDflt>0 ) goto generated_error;
  if( pType ){
    if( pType->n==7 && sqlite3StrNICmp("virtual",pType->z,7)==0 ){
      /* no-op */
    }else if( pType->n==6 && sqlite3StrNICmp("stored",pType->z,6)==0 ){
      eType = COLFLAG_STORED;
    }else{
      goto generated_error;
    }
  }
  if( eType==COLFLAG_VIRTUAL ) pTab->nNVCol--;
  pCol->colFlags |= eType;
  assert( TF_HasVirtual==COLFLAG_VIRTUAL );
  assert( TF_HasStored==COLFLAG_STORED );
  pTab->tabFlags |= eType;
  if( pCol->colFlags & COLFLAG_PRIMKEY ){
    makeColumnPartOfPrimaryKey(pParse, pCol); /* For the error message */
  }
  if( ALWAYS(pExpr) && pExpr->op==TK_ID ){
    /* The value of a generated column needs to be a real expression, not
    ** just a reference to another column, in order for covering index
    ** optimizations to work correctly.  So if the value is not an expression,
    ** turn it into one by adding a unary "+" operator. */
    pExpr = sqlite3PExpr(pParse, TK_UPLUS, pExpr, 0);
  }
  if( pExpr && pExpr->op!=TK_RAISE ) pExpr->affExpr = pCol->affinity;
  sqlite3ColumnSetExpr(pParse, pTab, pCol, pExpr);
  pExpr = 0;
  goto generated_done;

generated_error:
  sqlite3ErrorMsg(pParse, "error in generated column \"%s\"",
                  pCol->zCnName);
generated_done:
  sqlite3ExprDelete(pParse->db, pExpr);
#else
  /* Throw and error for the GENERATED ALWAYS AS clause if the
  ** SQLITE_OMIT_GENERATED_COLUMNS compile-time option is used. */
  sqlite3ErrorMsg(pParse, "generated columns not supported");
  sqlite3ExprDelete(pParse->db, pExpr);
#endif
}